

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotStems<short>
               (char *label_id,short *values,int count,double y_ref,double xscale,double x0,
               int offset,int stride)

{
  GetterYs<short> get_mark;
  GetterYRef get_base;
  GetterYs<short> local_48;
  GetterYRef local_20;
  
  if (count == 0) {
    local_48.Offset = 0;
  }
  else {
    local_48.Offset = (offset % count + count) % count;
  }
  local_48.Ys = values;
  local_48.Count = count;
  local_48.XScale = xscale;
  local_48.X0 = x0;
  local_48.Stride = stride;
  local_20.YRef = y_ref;
  local_20.Count = count;
  local_20.XScale = xscale;
  local_20.X0 = x0;
  PlotStemsEx<ImPlot::GetterYs<short>,ImPlot::GetterYRef>(label_id,&local_48,&local_20);
  return;
}

Assistant:

void PlotStems(const char* label_id, const T* values, int count, double y_ref, double xscale, double x0, int offset, int stride) {
    GetterYs<T> get_mark(values,count,xscale,x0,offset,stride);
    GetterYRef get_base(y_ref,count,xscale,x0);
    PlotStemsEx(label_id, get_mark, get_base);
}